

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

sftp_request * fxp_fsetstat_send(fxp_handle *handle,fxp_attrs attrs)

{
  BinarySink *bs;
  sftp_request *psVar1;
  sftp_packet *pkt;
  
  psVar1 = sftp_alloc_request();
  pkt = sftp_pkt_init(10);
  bs = pkt->binarysink_;
  BinarySink_put_uint32(bs,(ulong)psVar1->id);
  BinarySink_put_string(bs,handle->hstring,(long)handle->hlen);
  BinarySink_put_fxp_attrs(bs,attrs);
  sftp_send(pkt);
  return psVar1;
}

Assistant:

struct sftp_request *fxp_fsetstat_send(struct fxp_handle *handle,
                                       struct fxp_attrs attrs)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_FSETSTAT);
    put_uint32(pktout, req->id);
    put_string(pktout, handle->hstring, handle->hlen);
    put_fxp_attrs(pktout, attrs);
    sftp_send(pktout);

    return req;
}